

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldAppearance.h
# Opt level: O0

MinefieldAppearance * __thiscall
KDIS::DATA_TYPE::MinefieldAppearance::operator=
          (MinefieldAppearance *this,MinefieldAppearance *param_1)

{
  MinefieldAppearance *param_1_local;
  MinefieldAppearance *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  this->m_ui16BitUnion = param_1->m_ui16BitUnion;
  return this;
}

Assistant:

class KDIS_EXPORT MinefieldAppearance : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT16 m_ui16Type         : 2;
            KUINT16 m_ui16ActiveStatus : 1;
            KUINT16 m_ui16Lane         : 1;
            KUINT16 m_ui16Unused1      : 9;
            KUINT16 m_ui16State        : 1;
            KUINT16 m_ui16Unused       : 2;
        };
        KUINT16 m_ui16App;
    } m_ui16BitUnion;

public:

    static const KUINT16 MINEFIELD_APPEARANCE_SIZE = 2;

    MinefieldAppearance();

    MinefieldAppearance( KDIS::DATA_TYPE::ENUMS::MinefieldType T, KBOOL IsStatusActive, KBOOL IsLaneActive, KBOOL IsStateActive );

    MinefieldAppearance(KDataStream &stream) noexcept(false);

    virtual ~MinefieldAppearance();

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::SetMinefieldType
    //              KDIS::DATA_TYPE::MinefieldAppearance::GetMinefieldType
    // Description: The type of mines in the minefield. Anti personnel, anti tank or mixed.
    // Parameter:   MinefieldType T
    //************************************
    void SetMinefieldType( KDIS::DATA_TYPE::ENUMS::MinefieldType T );
    KDIS::DATA_TYPE::ENUMS::MinefieldType GetMinefieldType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::SetStatusActive
    //              KDIS::DATA_TYPE::MinefieldAppearance::IsStatusActive
    // Description: Identifies the active status of the minefield.
    //              Note: The DIS standard(SISO-REF-010-2006) specifies 0 for true and 1 for false however they are
    //              flipped internally by KDIS so you can use true and false as you would expect to.
    // Parameter:   KBOOL A
    //************************************
    void SetStatusActive( KBOOL A );
    KBOOL IsStatusActive() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::SetLaneActive
    //              KDIS::DATA_TYPE::MinefieldAppearance::IsLaneActive
    // Description: Identifies whether the minefield has an active lane.
    //              Note: The DIS standard(SISO-REF-010-2006) specifies 0 for true and 1 for false however they are
    //              flipped internally by KDIS so you can use true and false as you would expect to.
    // Parameter:   KBOOL A
    //************************************
    void SetLaneActive( KBOOL A );
    KBOOL IsLaneActive() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::SetStateActive
    //              KDIS::DATA_TYPE::MinefieldAppearance::IsStateActive
    // Description: Describes the state of the minefield.
    //              Note: The DIS standard(SISO-REF-010-2006) specifies 0 for true and 1 for false however they are
    //              flipped internally by KDIS so you can use true and false as you would expect to.
    // Parameter:   KBOOL A
    //************************************
    void SetStateActive( KBOOL A );
    KBOOL IsStateActive() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldAppearance::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const MinefieldAppearance & Value ) const;
    KBOOL operator != ( const MinefieldAppearance & Value ) const;
}